

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.cpp
# Opt level: O1

void __thiscall GrcManager::Clear(GrcManager *this)

{
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *pvVar1;
  pointer ppGVar2;
  void *pvVar3;
  GrcGlyphAttrMatrix *this_00;
  GrcLigComponentList *this_01;
  GdlRenderer *this_02;
  GrcMasterTable *pGVar4;
  GrcMasterValueList *this_03;
  GrcSymbolTable *this_04;
  GdlLangClass *this_05;
  pointer ppGVar5;
  pointer ppGVar6;
  pointer ppGVar7;
  pointer ppGVar8;
  pointer ppGVar9;
  long lVar10;
  pointer *pppGVar11;
  ulong uVar12;
  
  pvVar1 = this->m_prgvpglfcFsmClasses;
  if (pvVar1 != (vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)0x0) {
    ppGVar2 = pvVar1[-1].
              super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    pppGVar11 = &pvVar1[-1].
                 super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (ppGVar2 != (pointer)0x0) {
      lVar10 = (long)ppGVar2 * 0x18;
      do {
        pvVar3 = *(void **)((long)&pvVar1[-1].
                                   super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar10);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)pppGVar11 + lVar10) - (long)pvVar3);
        }
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != 0);
    }
    operator_delete__(pppGVar11,(long)ppGVar2 * 0x18 + 8);
  }
  ppGVar5 = (this->m_vpexpModified).
            super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppGVar8 = (this->m_vpexpModified).
            super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppGVar8 != ppGVar5) {
    uVar12 = 0;
    do {
      if (ppGVar5[uVar12] != (GdlExpression *)0x0) {
        (*ppGVar5[uVar12]->_vptr_GdlExpression[2])();
      }
      uVar12 = uVar12 + 1;
      ppGVar5 = (this->m_vpexpModified).
                super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppGVar8 = (this->m_vpexpModified).
                super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (uVar12 < (ulong)((long)ppGVar8 - (long)ppGVar5 >> 3));
  }
  if (ppGVar8 != ppGVar5) {
    (this->m_vpexpModified).super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppGVar5;
  }
  this_00 = this->m_pgax;
  if (this_00 != (GrcGlyphAttrMatrix *)0x0) {
    GrcGlyphAttrMatrix::~GrcGlyphAttrMatrix(this_00);
    operator_delete(this_00,0x20);
  }
  this_01 = this->m_plclist;
  if (this_01 != (GrcLigComponentList *)0x0) {
    GrcLigComponentList::~GrcLigComponentList(this_01);
    operator_delete(this_01,0x18);
  }
  this_02 = this->m_prndr;
  if (this_02 != (GdlRenderer *)0x0) {
    GdlRenderer::~GdlRenderer(this_02);
    operator_delete(this_02,0x118);
  }
  pGVar4 = this->m_mtbGlyphAttrs;
  if (pGVar4 != (GrcMasterTable *)0x0) {
    GrcMasterTable::~GrcMasterTable(pGVar4);
    operator_delete(pGVar4,0x30);
  }
  pGVar4 = this->m_mtbFeatures;
  if (pGVar4 != (GrcMasterTable *)0x0) {
    GrcMasterTable::~GrcMasterTable(pGVar4);
    operator_delete(pGVar4,0x30);
  }
  this_03 = this->m_mvlNameStrings;
  if (this_03 != (GrcMasterValueList *)0x0) {
    GrcMasterValueList::~GrcMasterValueList(this_03);
    operator_delete(this_03,0x30);
  }
  this_04 = this->m_psymtbl;
  if (this_04 != (GrcSymbolTable *)0x0) {
    GrcSymbolTable::~GrcSymbolTable(this_04);
    operator_delete(this_04,0x40);
  }
  ppGVar6 = (this->m_vplcls).super__Vector_base<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppGVar9 = (this->m_vplcls).super__Vector_base<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar9 != ppGVar6) {
    uVar12 = 0;
    do {
      this_05 = ppGVar6[uVar12];
      if (this_05 != (GdlLangClass *)0x0) {
        GdlLangClass::~GdlLangClass(this_05);
        operator_delete(this_05,0xc0);
      }
      uVar12 = uVar12 + 1;
      ppGVar6 = (this->m_vplcls).super__Vector_base<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppGVar9 = (this->m_vplcls).super__Vector_base<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar12 < (ulong)((long)ppGVar9 - (long)ppGVar6 >> 3));
  }
  if (ppGVar9 != ppGVar6) {
    (this->m_vplcls).super__Vector_base<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppGVar6;
  }
  ppGVar7 = (this->m_vpfeatInput).
            super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_vpfeatInput).super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppGVar7) {
    uVar12 = 0;
    do {
      if (ppGVar7[uVar12] != (GdlFeatureDefn *)0x0) {
        (*(ppGVar7[uVar12]->super_GdlDefn)._vptr_GdlDefn[1])();
      }
      uVar12 = uVar12 + 1;
      ppGVar7 = (this->m_vpfeatInput).
                super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(this->m_vpfeatInput).
                                    super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar7 >> 3)
            );
  }
  return;
}

Assistant:

void GrcManager::Clear()
{
	if (m_prgvpglfcFsmClasses)
		delete[] m_prgvpglfcFsmClasses;

	size_t i;
	for (i = 0; i < m_vpexpModified.size(); ++i)
		delete m_vpexpModified[i];
	m_vpexpModified.clear();

	if (m_pgax)
		delete m_pgax;
	if (m_plclist)
		delete m_plclist;

	if (m_prndr)
		delete m_prndr;

	if (m_mtbGlyphAttrs)
		delete m_mtbGlyphAttrs;
	if (m_mtbFeatures)
		delete m_mtbFeatures;
	if (m_mvlNameStrings)
		delete m_mvlNameStrings;

	if (m_psymtbl)
		delete m_psymtbl;

	for (i = 0; i < this->m_vplcls.size(); i++)
		delete m_vplcls[i];
	m_vplcls.clear();

	for (i = 0; i < m_vpfeatInput.size(); ++i)
		delete m_vpfeatInput[i];
}